

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool CoreML::hasIOS16Features(Model *model)

{
  bool bVar1;
  
  bVar1 = hasFloat16MultiArray(model);
  if (!bVar1) {
    bVar1 = hasGrayscaleFloat16Image(model);
    if (!bVar1) {
      bVar1 = hasCoreML6Opsets(model);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool CoreML::hasIOS16Features(const Specification::Model& model) {
    // New in IOS16 features:
    //  - FLOAT16 array data type
    //  - GRAYSCALE_FLOAT16 image color space.
    //  - CoreML6 Opsets for mlProgram models
    
    bool result = false;
    result = result || hasFloat16MultiArray(model);
    result = result || hasGrayscaleFloat16Image(model);
    result = result || hasCoreML6Opsets(model);

    return result;
}